

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::Fl_Tree(Fl_Tree *this,int X,int Y,int W,int H,char *L)

{
  Fl_Tree_Item *this_00;
  Fl_Scrollbar *this_01;
  int local_4c;
  int scrollsize;
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Tree *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Tree_002edb58;
  Fl_Tree_Prefs::Fl_Tree_Prefs(&this->_prefs);
  this_00 = (Fl_Tree_Item *)operator_new(0x88);
  Fl_Tree_Item::Fl_Tree_Item(this_00,&this->_prefs);
  this->_root = this_00;
  Fl_Tree_Item::parent(this->_root,(Fl_Tree_Item *)0x0);
  Fl_Tree_Item::label(this->_root,"ROOT");
  this->_item_focus = (Fl_Tree_Item *)0x0;
  this->_callback_item = (Fl_Tree_Item *)0x0;
  this->_callback_reason = FL_TREE_REASON_NONE;
  this->_scrollbar_size = 0;
  Fl_Widget::box((Fl_Widget *)this,FL_DOWN_BOX);
  Fl_Widget::color((Fl_Widget *)this,7,0xf);
  Fl_Widget::when((Fl_Widget *)this,'\x01');
  if (this->_scrollbar_size == 0) {
    local_4c = Fl::scrollbar_size();
  }
  else {
    local_4c = this->_scrollbar_size;
  }
  this_01 = (Fl_Scrollbar *)operator_new(0xb8);
  Fl_Scrollbar::Fl_Scrollbar(this_01,(X + W) - local_4c,Y,local_4c,H,(char *)0x0);
  this->_vscroll = this_01;
  (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
  Fl_Widget::type((Fl_Widget *)this->_vscroll,'\0');
  Fl_Valuator::step((Fl_Valuator *)this->_vscroll,1);
  Fl_Widget::callback((Fl_Widget *)this->_vscroll,scroll_cb,this);
  Fl_Group::end(&this->super_Fl_Group);
  return;
}

Assistant:

Fl_Tree::Fl_Tree(int X, int Y, int W, int H, const char *L) : Fl_Group(X,Y,W,H,L) { 
#if FLTK_ABI_VERSION >= 10303
  _root = new Fl_Tree_Item(this);
#else
  _root = new Fl_Tree_Item(_prefs);
#endif
  _root->parent(0);				// we are root of tree
  _root->label("ROOT");
  _item_focus      = 0;
  _callback_item   = 0;
  _callback_reason = FL_TREE_REASON_NONE;
  _scrollbar_size  = 0;				// 0: uses Fl::scrollbar_size()
	
#if FLTK_ABI_VERSION >= 10301
  // NEW
  _lastselect       = 0;
#else /*FLTK_ABI_VERSION*/
  // OLD: data initialized static inside handle()
#endif /*FLTK_ABI_VERSION*/

  box(FL_DOWN_BOX);
  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);
  when(FL_WHEN_CHANGED);
  int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
  _vscroll = new Fl_Scrollbar(X+W-scrollsize,Y,scrollsize,H);
  _vscroll->hide();
  _vscroll->type(FL_VERTICAL);
  _vscroll->step(1);
  _vscroll->callback(scroll_cb, (void*)this);
#if FLTK_ABI_VERSION >= 10303
  _hscroll = new Fl_Scrollbar(X,Y+H-scrollsize,W,scrollsize);
  _hscroll->hide();
  _hscroll->type(FL_HORIZONTAL);
  _hscroll->step(1);
  _hscroll->callback(scroll_cb, (void*)this);
  _tox = _tix = X + Fl::box_dx(box());
  _toy = _tiy = Y + Fl::box_dy(box());
  _tow = _tiw = W - Fl::box_dw(box());
  _toh = _tih = H - Fl::box_dh(box());
  _tree_w = -1;
  _tree_h = -1;
#endif
  end();
}